

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long_long,_long_long,_15>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *lhs,longlong *rhs,longlong *result)

{
  code *pcVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  uint64_t tmp_1;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    uVar3 = *in_RDI;
    uVar2 = AbsValueHelper<long_long,_1>::Abs(0x239731);
    uVar3 = uVar3 + uVar2;
    if ((uVar3 < *in_RDI) || (uVar4 = std::numeric_limits<long_long>::max(), uVar4 < uVar3)) {
LAB_00239809:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = uVar3;
  }
  else if (*in_RDI < *in_RSI) {
    if (SBORROW8(*in_RDI,*in_RSI)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_RDX = *in_RDI - *in_RSI;
  }
  else {
    uVar3 = *in_RDI;
    uVar4 = *in_RSI;
    uVar5 = std::numeric_limits<long_long>::max();
    if (uVar5 < uVar3 - uVar4) goto LAB_00239809;
    *in_RDX = uVar3 - uVar4;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U is std::uint64_t, T is signed
        if( rhs < 0 )
        {
            // treat this as addition
            std::uint64_t tmp = 0;

            tmp = lhs + (std::uint64_t)AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( rhs );

            // must check for addition overflow and max
            if( tmp >= lhs && tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        else if( (std::uint64_t)rhs > lhs ) // now both are positive, so comparison always works
        {
            // result is negative
            // implies that lhs must fit into T, and result cannot overflow
            // Also allows us to drop to 32-bit math, which is faster on a 32-bit system
            result = (T)lhs - (T)rhs;
            return;
        }
        else
        {
            // result is positive
            std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }